

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::beginMapping(Input *this)

{
  HNode *pHVar1;
  
  if ((((this->EC)._M_value == 0) && (pHVar1 = this->CurrentNode, pHVar1 != (HNode *)0x0)) &&
     (pHVar1->_node->TypeID == 4)) {
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::clear((SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(pHVar1 + 3));
    return;
  }
  return;
}

Assistant:

void Input::beginMapping() {
  if (EC)
    return;
  // CurrentNode can be null if the document is empty.
  MapHNode *MN = dyn_cast_or_null<MapHNode>(CurrentNode);
  if (MN) {
    MN->ValidKeys.clear();
  }
}